

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

bool __thiscall
google::protobuf::FileDescriptorSet::MergePartialFromCodedStream
          (FileDescriptorSet *this,CodedInputStream *input)

{
  int *piVar1;
  uint8 uVar2;
  int iVar3;
  int iVar4;
  uint8 *puVar5;
  void **ppvVar6;
  bool bVar7;
  Limit limit;
  FileDescriptorProto *this_00;
  uint32 tag;
  uint32 local_3c;
  UnknownFieldSet *local_38;
  
  local_38 = &this->_unknown_fields_;
  do {
    while( true ) {
      puVar5 = input->buffer_;
      if ((puVar5 < input->buffer_end_) && (tag = (uint32)(char)*puVar5, -1 < (char)*puVar5)) {
        input->last_tag_ = tag;
        input->buffer_ = puVar5 + 1;
      }
      else {
        tag = io::CodedInputStream::ReadTagFallback(input);
        input->last_tag_ = tag;
      }
      if (tag == 10) break;
      if (tag == 0) {
        return true;
      }
      if ((tag & 7) == 4) {
        return true;
      }
      bVar7 = internal::WireFormat::SkipField(input,tag,local_38);
      if (!bVar7) {
        return false;
      }
    }
    while( true ) {
      iVar3 = (this->file_).super_RepeatedPtrFieldBase.current_size_;
      iVar4 = (this->file_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar3 < iVar4) {
        ppvVar6 = (this->file_).super_RepeatedPtrFieldBase.elements_;
        (this->file_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
        this_00 = (FileDescriptorProto *)ppvVar6[iVar3];
      }
      else {
        iVar3 = (this->file_).super_RepeatedPtrFieldBase.total_size_;
        if (iVar4 == iVar3) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(this->file_).super_RepeatedPtrFieldBase,iVar3 + 1);
        }
        piVar1 = &(this->file_).super_RepeatedPtrFieldBase.allocated_size_;
        *piVar1 = *piVar1 + 1;
        this_00 = internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>::New();
        ppvVar6 = (this->file_).super_RepeatedPtrFieldBase.elements_;
        iVar3 = (this->file_).super_RepeatedPtrFieldBase.current_size_;
        (this->file_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
        ppvVar6[iVar3] = this_00;
      }
      puVar5 = input->buffer_;
      if ((puVar5 < input->buffer_end_) && (uVar2 = *puVar5, -1 < (char)uVar2)) {
        input->buffer_ = puVar5 + 1;
        local_3c = (int)(char)uVar2;
      }
      else {
        bVar7 = io::CodedInputStream::ReadVarint32Fallback(input,&local_3c);
        if (!bVar7) {
          return false;
        }
      }
      iVar3 = input->recursion_depth_;
      input->recursion_depth_ = iVar3 + 1;
      if (input->recursion_limit_ <= iVar3) {
        return false;
      }
      limit = io::CodedInputStream::PushLimit(input,local_3c);
      bVar7 = FileDescriptorProto::MergePartialFromCodedStream(this_00,input);
      if (!bVar7) {
        return false;
      }
      if (input->legitimate_message_end_ != true) {
        return false;
      }
      io::CodedInputStream::PopLimit(input,limit);
      if (0 < input->recursion_depth_) {
        input->recursion_depth_ = input->recursion_depth_ + -1;
      }
      puVar5 = input->buffer_;
      if ((input->buffer_end_ <= puVar5) || (*puVar5 != '\n')) break;
      input->buffer_ = puVar5 + 1;
    }
    if ((input->buffer_ == input->buffer_end_) &&
       ((input->buffer_size_after_limit_ != 0 || (input->total_bytes_read_ == input->current_limit_)
        ))) {
      input->last_tag_ = 0;
      input->legitimate_message_end_ = true;
      return true;
    }
  } while( true );
}

Assistant:

bool FileDescriptorSet::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated .google.protobuf.FileDescriptorProto file = 1;
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_file:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_file()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(10)) goto parse_file;
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}